

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsNumberToDouble(JsValueRef value,double *asDouble)

{
  bool bVar1;
  JsErrorCode JVar2;
  double dVar3;
  DebugCheckNoException local_20;
  DebugCheckNoException __debugCheckNoException;
  
  if (value == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (asDouble == (double *)0x0) {
    return JsErrorNullArgument;
  }
  local_20.hasException = true;
  local_20.__exceptionCheck = ExceptionCheck::Save();
  bVar1 = Js::TaggedInt::Is(value);
  if (bVar1) {
    dVar3 = (double)(int)value;
  }
  else {
    if ((ulong)value >> 0x32 == 0) {
      JVar2 = JsErrorInvalidArgument;
      dVar3 = 0.0;
      goto LAB_00360e8b;
    }
    dVar3 = Js::JavascriptNumber::GetValue(value);
  }
  JVar2 = JsNoError;
LAB_00360e8b:
  *asDouble = dVar3;
  local_20.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_20);
  return JVar2;
}

Assistant:

CHAKRA_API JsNumberToDouble(_In_ JsValueRef value, _Out_ double *asDouble)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(asDouble);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (Js::TaggedInt::Is(value))
        {
            *asDouble = Js::TaggedInt::ToDouble(value);
        }